

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsTTDCheckAndAssertIfTTDRunning(char *msg)

{
  JsrtContext *pJVar1;
  
  pJVar1 = JsrtContext::GetCurrent();
  if ((pJVar1 != (JsrtContext *)0x0) &&
     (((((pJVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
      TTDShouldPerformRecordAction == true)) {
    TTDAbort_unrecoverable_error(msg);
  }
  return JsNoError;
}

Assistant:

CHAKRA_API JsTTDCheckAndAssertIfTTDRunning(_In_ const char* msg)
{
#if ENABLE_TTD
    JsrtContext* context = JsrtContext::GetCurrent();
    TTDAssert(context == nullptr || !context->GetScriptContext()->ShouldPerformRecordAction(), msg);
#endif
    return JsNoError;
}